

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void gimage::hsvToRGB<int>(int *red,int *green,int *blue,int maxval,float hue,float sat,float val)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar6 = (float)maxval * val;
  if ((sat == 0.0) && (!NAN(sat))) {
    iVar1 = (int)(fVar6 + 0.5);
    *blue = iVar1;
    *green = iVar1;
    *red = iVar1;
    return;
  }
  fVar2 = floorf(hue);
  fVar3 = (1.0 - sat) * fVar6;
  fVar5 = (1.0 - (hue - (float)(int)fVar2) * sat) * fVar6;
  if (4 < (uint)(int)fVar2) {
    *red = (int)(fVar6 + 0.5);
    *green = (int)(fVar3 + 0.5);
    iVar1 = (int)(fVar5 + 0.5);
    goto LAB_00125920;
  }
  fVar4 = (1.0 - sat * (1.0 - (hue - (float)(int)fVar2))) * fVar6;
  switch((int)fVar2) {
  case 0:
    *red = (int)(fVar6 + 0.5);
    *green = (int)(fVar4 + 0.5);
    break;
  case 1:
    *red = (int)(fVar5 + 0.5);
    *green = (int)(fVar6 + 0.5);
    break;
  case 2:
    *red = (int)(fVar3 + 0.5);
    *green = (int)(fVar6 + 0.5);
    iVar1 = (int)(fVar4 + 0.5);
    goto LAB_00125920;
  case 3:
    *red = (int)(fVar3 + 0.5);
    *green = (int)(fVar5 + 0.5);
    goto LAB_001258cc;
  case 4:
    *red = (int)(fVar4 + 0.5);
    *green = (int)(fVar3 + 0.5);
LAB_001258cc:
    iVar1 = (int)(fVar6 + 0.5);
    goto LAB_00125920;
  }
  iVar1 = (int)(fVar3 + 0.5);
LAB_00125920:
  *blue = iVar1;
  return;
}

Assistant:

void hsvToRGB(T &red, T &green, T &blue, T maxval, float hue, float sat, float val)
{
  val*=maxval;

  if (sat != 0)
  {
    int   i=static_cast<int>(floorf(hue));
    float f=hue-i;
    float p=val*(1-sat);
    float q=val*(1-f*sat);
    float t=val*(1-sat*(1-f));

    switch (i)
    {
      case 0:
        red=static_cast<T>(val+0.5f);
        green=static_cast<T>(t+0.5f);
        blue=static_cast<T>(p+0.5f);
        break;

      case 1:
        red=static_cast<T>(q+0.5f);
        green=static_cast<T>(val+0.5f);
        blue=static_cast<T>(p+0.5f);
        break;

      case 2:
        red=static_cast<T>(p+0.5f);
        green=static_cast<T>(val+0.5f);
        blue=static_cast<T>(t+0.5f);
        break;

      case 3:
        red=static_cast<T>(p+0.5f);
        green=static_cast<T>(q+0.5f);
        blue=static_cast<T>(val+0.5f);
        break;

      case 4:
        red=static_cast<T>(t+0.5f);
        green=static_cast<T>(p+0.5f);
        blue=static_cast<T>(val+0.5f);
        break;

      default:
        red=static_cast<T>(val+0.5f);
        green=static_cast<T>(p+0.5f);
        blue=static_cast<T>(q+0.5f);
        break;
    }
  }
  else
  {
    red=green=blue=static_cast<T>(val+0.5f);
  }
}